

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall KeyData_Constructor_Test::TestBody(KeyData_Constructor_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  string local_1b8;
  AssertHelper local_198;
  Message local_190 [3];
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  KeyData empty_obj;
  KeyData_Constructor_Test *this_local;
  
  cfd::core::KeyData::KeyData((KeyData *)&gtest_ar_.message_);
  bVar1 = cfd::core::KeyData::IsValid();
  local_171 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b8,(internal *)local_170,(AssertionResult *)"empty_obj.IsValid()","true",
               "false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_keydata.cpp"
               ,0x18,message);
    testing::internal::AssertHelper::operator=(&local_198,local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(KeyData, Constructor) {
  KeyData empty_obj;
  EXPECT_FALSE(empty_obj.IsValid());
}